

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

int Abc_NodeCompareLevels(Abc_Obj_t **pp1,Abc_Obj_t **pp2)

{
  int iVar1;
  int iVar2;
  int Diff;
  Abc_Obj_t **pp2_local;
  Abc_Obj_t **pp1_local;
  
  iVar1 = Abc_ObjLevel(*pp1);
  iVar2 = Abc_ObjLevel(*pp2);
  if (iVar1 - iVar2 < 0) {
    pp1_local._4_4_ = -1;
  }
  else if (iVar1 - iVar2 < 1) {
    iVar1 = (*pp1)->Id - (*pp2)->Id;
    if (iVar1 < 0) {
      pp1_local._4_4_ = -1;
    }
    else if (iVar1 < 1) {
      pp1_local._4_4_ = 0;
    }
    else {
      pp1_local._4_4_ = 1;
    }
  }
  else {
    pp1_local._4_4_ = 1;
  }
  return pp1_local._4_4_;
}

Assistant:

int Abc_NodeCompareLevels( Abc_Obj_t ** pp1, Abc_Obj_t ** pp2 )
{
    int Diff = Abc_ObjLevel(*pp1) - Abc_ObjLevel(*pp2);
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    Diff = (*pp1)->Id - (*pp2)->Id; // needed to make qsort() platform-infependent
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}